

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O0

uint __thiscall Shell::EqualityProxyMono::getProxyPredicate(EqualityProxyMono *this,TermList sort)

{
  initializer_list<Kernel::TermList> sorts;
  bool bVar1;
  TermList TVar2;
  void *pvVar3;
  Inference *this_00;
  NonspecificInference0 *gi;
  undefined8 in_RSI;
  char *unaff_retaddr;
  uint in_stack_0000000c;
  Signature *in_stack_00000010;
  FormulaUnit *defUnit;
  Formula *quantDefForm;
  Formula *defForm;
  Literal *eqLit;
  Literal *proxyLit;
  OperatorType *predType;
  Symbol *predSym;
  uint newPred;
  uint pred;
  Formula *in_stack_fffffffffffffec8;
  Signature *in_stack_fffffffffffffed0;
  DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  SymbolType st;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar5;
  TermList in_stack_fffffffffffffef0;
  iterator in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  NonspecificInference0 local_f2;
  Inference *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  TermList in_stack_ffffffffffffff20;
  TermList in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  Formula *in_stack_ffffffffffffff90;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined8 local_38;
  OperatorType *local_30;
  Symbol *local_28;
  SymbolType local_20;
  SymbolType local_1c;
  undefined8 local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  Connective con;
  
  local_10 = in_RSI;
  bVar1 = Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                    (in_stack_fffffffffffffed8,(TermList *)in_stack_fffffffffffffed0,
                     &in_stack_fffffffffffffec8->_connective);
  local_20 = local_1c;
  if (!bVar1) {
    local_20 = Kernel::Signature::addFreshPredicate
                         (in_stack_00000010,in_stack_0000000c,unaff_retaddr,
                          (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    local_28 = Kernel::Signature::getPredicate
                         (in_stack_fffffffffffffed0,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                         );
    local_50 = local_10;
    local_48 = local_10;
    local_40 = &local_50;
    local_38 = 2;
    sorts._M_len = in_stack_ffffffffffffff00;
    sorts._M_array = in_stack_fffffffffffffef8;
    local_30 = Kernel::OperatorType::getPredicateType
                         (sorts,(uint)(in_stack_fffffffffffffef0._content >> 0x20));
    Kernel::Signature::Symbol::setType
              ((Symbol *)in_stack_fffffffffffffed0,(OperatorType *)in_stack_fffffffffffffec8);
    Kernel::Signature::Symbol::markEqualityProxy(local_28);
    Kernel::Signature::Symbol::markSkipCongruence(local_28);
    Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              ((DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffef0,in_stack_fffffffffffffee4);
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffef0);
    uVar4 = 0;
    st = local_20;
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,
               (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    uVar5 = 1;
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,
               (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    TVar2._content._4_4_ = uVar5;
    TVar2._content._0_4_ = uVar4;
    Kernel::Literal::create2
              (st,SUB41(in_stack_fffffffffffffee0 >> 0x18,0),in_stack_fffffffffffffef0,TVar2);
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,
               (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,
               (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::Literal::createEquality
              ((bool)in_stack_ffffffffffffff1f,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    TVar2._content = (uint64_t)Kernel::BinaryFormula::operator_new(0xb91a83);
    Kernel::AtomicFormula::operator_new(0xb91a92);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)in_stack_fffffffffffffed0,(Literal *)in_stack_fffffffffffffec8);
    pvVar3 = Kernel::AtomicFormula::operator_new(0xb91ab7);
    con = (Connective)((ulong)pvVar3 >> 0x20);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)in_stack_fffffffffffffed0,(Literal *)in_stack_fffffffffffffec8);
    Kernel::BinaryFormula::BinaryFormula
              ((BinaryFormula *)CONCAT44(st,in_stack_fffffffffffffee0),con,
               (Formula *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    this_00 = (Inference *)Kernel::Formula::quantify(in_stack_ffffffffffffff90);
    gi = (NonspecificInference0 *)Kernel::FormulaUnit::operator_new(0xb91b19);
    Kernel::NonspecificInference0::NonspecificInference0(&local_f2,AXIOM,EQUALITY_PROXY_AXIOM1);
    Kernel::Inference::Inference(this_00,gi);
    Kernel::FormulaUnit::FormulaUnit
              ((FormulaUnit *)in_stack_ffffffffffffff20._content,
               (Formula *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
    Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff10);
    Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              ((DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               CONCAT44(uVar5,uVar4),TVar2,(Unit *)CONCAT44(st,in_stack_fffffffffffffee0));
    Kernel::InferenceStore::instance();
    Kernel::InferenceStore::recordIntroducedSymbol
              ((InferenceStore *)TVar2._content,(Unit *)CONCAT44(uVar5,uVar4),st,
               in_stack_fffffffffffffee0);
  }
  return local_20;
}

Assistant:

unsigned EqualityProxyMono::getProxyPredicate(TermList sort)
{
  unsigned pred;
  if (s_proxyPredicates.find(sort, pred)) {
    return pred;
  }

  unsigned newPred = env.signature->addFreshPredicate(2,"sQ","eqProxy");
  Signature::Symbol* predSym = env.signature->getPredicate(newPred);
  OperatorType* predType = OperatorType::getPredicateType({sort, sort});
  predSym->setType(predType);
  predSym->markEqualityProxy();
  // don't need congruence axioms for the equality predicate itself
  predSym->markSkipCongruence();

  ASS(sort.isTerm());
  ASS(sort.term()->shared());
  ASS(sort.term()->ground());

  ALWAYS(s_proxyPredicates.insert(sort,newPred));
  s_proxyPredicateSorts.insert(newPred,sort);

  Literal* proxyLit = Literal::create2(newPred,true,TermList(0,false),TermList(1,false));
  Literal* eqLit = Literal::createEquality(true,TermList(0,false),TermList(1,false),sort);
  Formula* defForm = new BinaryFormula(IFF, new AtomicFormula(proxyLit), new AtomicFormula(eqLit));
  Formula* quantDefForm = Formula::quantify(defForm);

  FormulaUnit* defUnit = new FormulaUnit(quantDefForm,NonspecificInference0(UnitInputType::AXIOM,InferenceRule::EQUALITY_PROXY_AXIOM1));

  s_proxyPremises.insert(sort, defUnit);
  InferenceStore::instance()->recordIntroducedSymbol(defUnit, SymbolType::PRED, newPred);
  return newPred;
}